

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::unary(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Parser *in_RSI;
  ptr<Expression> pVar5;
  undefined1 local_39;
  _Alloc_hider local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  bVar3 = match(in_RSI,Neg);
  if (bVar3) {
    consume(in_RSI);
    unary((Parser *)&stack0xffffffffffffffd8);
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Negation,std::allocator<Negation>,std::shared_ptr<Expression>&>
              (&_Stack_30,(Negation **)&local_38,(allocator<Negation> *)&local_39,
               (shared_ptr<Expression> *)&stack0xffffffffffffffd8);
    _Var4._M_pi = extraout_RDX;
LAB_0010fde6:
    _Var2._M_pi = _Stack_30._M_pi;
    (this->filepath)._M_dataplus._M_p = local_38._M_p;
    (this->filepath)._M_string_length = 0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
    local_38._M_p = (pointer)0x0;
  }
  else {
    bVar3 = match(in_RSI,Minus);
    if (bVar3) {
      consume(in_RSI);
      unary((Parser *)&stack0xffffffffffffffd8);
      local_38._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Negative,std::allocator<Negative>,std::shared_ptr<Expression>&>
                (&_Stack_30,(Negative **)&local_38,(allocator<Negative> *)&local_39,
                 (shared_ptr<Expression> *)&stack0xffffffffffffffd8);
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_0010fde6;
    }
    bVar3 = match(in_RSI,New);
    if (!bVar3) {
      pVar5 = primary(this);
      _Var4 = pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_0010fe16;
    }
    consume(in_RSI);
    primary(this);
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<New,std::allocator<New>,std::shared_ptr<Expression>&>
              (&_Stack_30,(New **)&local_38,(allocator<New> *)&stack0xffffffffffffffd8,
               (shared_ptr<Expression> *)this);
    _Var4._M_pi = _Stack_30._M_pi;
    _Var1._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
    (this->filepath)._M_dataplus._M_p = _Var1._M_p;
    (this->filepath)._M_string_length = (size_type)_Var4._M_pi;
    _Var4._M_pi = extraout_RDX_02;
    local_20._M_pi = _Stack_30._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var4._M_pi = extraout_RDX_03;
      local_20._M_pi = _Stack_30._M_pi;
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
LAB_0010fe16:
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::unary() {
    if(match(TokenType::Neg)) {
        consume();
        return make<Negation>(unary());
    }

    if(match(TokenType::Minus)) {
        consume();
        return make<Negative>(unary());
    }

    bool isNew = false;
    if(match(TokenType::New)) {
        consume();
        isNew = true;
    }

    ptr<Expression> expr = primary();

    if(isNew) {
        expr = make<New>(expr);
    }

    return expr;
}